

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O2

bool __thiscall HttpHeader::addDateField(HttpHeader *this)

{
  bool bVar1;
  time_t t;
  tm tmp;
  char buf [64];
  
  t = time((time_t *)0x0);
  localtime_r(&t,(tm *)&tmp);
  strftime(buf,0x40,"%a, %b %e %T %Y",(tm *)&tmp);
  bVar1 = HttpHeaderBase::addField(&this->super_HttpHeaderBase,0x3f9,buf);
  return bVar1;
}

Assistant:

bool HttpHeader::addDateField()
{
	time_t t = time( NULL );
	struct tm tmp;
	localtime_r(&t, &tmp);

	char buf[64];
	strftime(buf, 64, "%a, %b %e %T %Y", &tmp);
	return addField(HttpFieldMap::kFieldDate, buf);
}